

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

uint Map_CalculatePhase(uint (*uTruths) [2],int nVars,uint uTruth,uint uPhase)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 1;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((uVar1 & uPhase) != 0) {
      uTruth = (uTruths[uVar3][0] & uTruth) >> ((byte)uVar1 & 0x1f) |
               (~uTruths[uVar3][0] & uTruth) << ((byte)uVar1 & 0x1f);
    }
    uVar1 = uVar1 * 2;
  }
  return uTruth;
}

Assistant:

unsigned Map_CalculatePhase( unsigned uTruths[][2], int nVars, unsigned uTruth, unsigned uPhase )
{
    int v, Shift;
    for ( v = 0, Shift = 1; v < nVars; v++, Shift <<= 1 )
        if ( uPhase & Shift )
            uTruth = (((uTruth & ~uTruths[v][0]) << Shift) | ((uTruth & uTruths[v][0]) >> Shift));
    return uTruth;
}